

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O1

bool __thiscall BlockDevice::ReadMakeModelRevisionSerial(BlockDevice *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __fd;
  undefined8 uVar2;
  int iVar3;
  BlockDevice *pBVar4;
  BlockDevice *this_00;
  bool bVar5;
  size_type __dnew;
  size_type __dnew_1;
  string s;
  string local_c8;
  undefined1 local_a8 [32];
  string local_88;
  undefined4 local_68;
  
  __fd = (this->super_HDD).h;
  pBVar4 = (BlockDevice *)(ulong)__fd;
  iVar3 = ioctl(__fd,0x30d,&ReadMakeModelRevisionSerial::hd);
  if (iVar3 == 0) {
    local_c8._M_dataplus._M_p = (pointer)0x28;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_c8);
    local_88.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
    *(undefined8 *)((uchar *)local_88._M_dataplus._M_p + 0x20) =
         ReadMakeModelRevisionSerial::hd.model._32_8_;
    uVar2 = ReadMakeModelRevisionSerial::hd.model._24_8_;
    *(undefined8 *)((uchar *)local_88._M_dataplus._M_p + 0x10) =
         ReadMakeModelRevisionSerial::hd.model._16_8_;
    *(undefined8 *)((uchar *)local_88._M_dataplus._M_p + 0x18) = uVar2;
    uVar2 = ReadMakeModelRevisionSerial::hd.model._8_8_;
    *(undefined8 *)local_88._M_dataplus._M_p = ReadMakeModelRevisionSerial::hd.model._0_8_;
    *(undefined8 *)((uchar *)local_88._M_dataplus._M_p + 8) = uVar2;
    local_88._M_string_length = (size_type)local_c8._M_dataplus._M_p;
    ((uchar *)local_88._M_dataplus._M_p)[(long)local_c8._M_dataplus._M_p] = '\0';
    util::trim(&local_c8,&local_88);
    std::__cxx11::string::operator=((string *)&(this->super_HDD).strMakeModel,(string *)&local_c8);
    paVar1 = &local_c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_a8._0_8_ = (pointer)0x14;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    local_c8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)local_a8);
    local_c8.field_2._M_allocated_capacity = local_a8._0_8_;
    *(undefined4 *)((uchar *)local_c8._M_dataplus._M_p + 0x10) =
         ReadMakeModelRevisionSerial::hd.serial_no._16_4_;
    uVar2 = ReadMakeModelRevisionSerial::hd.serial_no._8_8_;
    *(undefined8 *)local_c8._M_dataplus._M_p = ReadMakeModelRevisionSerial::hd.serial_no._0_8_;
    *(undefined8 *)((uchar *)local_c8._M_dataplus._M_p + 8) = uVar2;
    local_c8._M_string_length = local_a8._0_8_;
    ((uchar *)local_c8._M_dataplus._M_p)[local_a8._0_8_] = '\0';
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    util::trim(&local_c8,&local_88);
    std::__cxx11::string::operator=
              ((string *)&(this->super_HDD).strSerialNumber,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8.field_2._M_local_buf[0] = ReadMakeModelRevisionSerial::hd.fw_rev[0];
    local_c8.field_2._M_local_buf[1] = ReadMakeModelRevisionSerial::hd.fw_rev[1];
    local_c8.field_2._M_local_buf[2] = ReadMakeModelRevisionSerial::hd.fw_rev[2];
    local_c8.field_2._M_local_buf[3] = ReadMakeModelRevisionSerial::hd.fw_rev[3];
    local_c8.field_2._M_local_buf[4] = ReadMakeModelRevisionSerial::hd.fw_rev[4];
    local_c8.field_2._M_local_buf[5] = ReadMakeModelRevisionSerial::hd.fw_rev[5];
    local_c8.field_2._M_local_buf[6] = ReadMakeModelRevisionSerial::hd.fw_rev[6];
    local_c8.field_2._M_local_buf[7] = ReadMakeModelRevisionSerial::hd.fw_rev[7];
    local_c8._M_string_length = 8;
    local_c8.field_2._M_local_buf[8] = '\0';
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    util::trim(&local_c8,&local_88);
    std::__cxx11::string::operator=
              ((string *)&(this->super_HDD).strFirmwareRevision,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    bVar5 = true;
  }
  else {
    iVar3 = ScsiCmd(pBVar4,(this->super_HDD).h,"\x12",6,&local_88,0x60,true);
    bVar5 = iVar3 == 0;
    if (bVar5) {
      local_a8._0_8_ = (BlockDevice *)0x10;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)local_a8);
      local_c8.field_2._M_allocated_capacity = local_a8._0_8_;
      *(size_type *)local_c8._M_dataplus._M_p = local_88.field_2._M_allocated_capacity;
      *(undefined8 *)((long)local_c8._M_dataplus._M_p + 8) = local_88.field_2._8_8_;
      local_c8._M_string_length = local_a8._0_8_;
      *(char *)((long)local_c8._M_dataplus._M_p + local_a8._0_8_) = '\0';
      util::trim((string *)local_a8,&local_c8);
      std::__cxx11::string::operator=((string *)&(this->super_HDD).strMakeModel,(string *)local_a8);
      pBVar4 = (BlockDevice *)(local_a8 + 0x10);
      if ((BlockDevice *)local_a8._0_8_ != pBVar4) {
        operator_delete((void *)local_a8._0_8_,CONCAT44(local_a8._20_4_,local_a8._16_4_) + 1);
      }
      local_a8._16_4_ = local_68;
      local_a8._8_8_ = 4;
      local_a8._20_4_ = local_a8._20_4_ & 0xffffff00;
      local_a8._0_8_ = pBVar4;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)local_a8);
      if ((BlockDevice *)local_a8._0_8_ != pBVar4) {
        operator_delete((void *)local_a8._0_8_,CONCAT44(local_a8._20_4_,local_a8._16_4_) + 1);
      }
      util::trim((string *)local_a8,&local_c8);
      std::__cxx11::string::operator=
                ((string *)&(this->super_HDD).strFirmwareRevision,(string *)local_a8);
      this_00 = (BlockDevice *)local_a8._0_8_;
      if ((BlockDevice *)local_a8._0_8_ != pBVar4) {
        operator_delete((void *)local_a8._0_8_,CONCAT44(local_a8._20_4_,local_a8._16_4_) + 1);
      }
      ScsiCmd(this_00,(this->super_HDD).h,ReadMakeModelRevisionSerial::cmdSerial,6,&local_88,0x60,
              true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        (ulong)(local_c8.field_2._M_allocated_capacity + 1));
      }
    }
  }
  return bVar5;
}

Assistant:

bool BlockDevice::ReadMakeModelRevisionSerial(const std::string& path)
{
#ifdef _WIN32
    (void)path; // unused
    MEMORY mem(512);
    PSTORAGE_DEVICE_DESCRIPTOR pDevDesc = reinterpret_cast<PSTORAGE_DEVICE_DESCRIPTOR>(mem.pb);
    pDevDesc->Size = static_cast<DWORD>(mem.size);

    STORAGE_PROPERTY_QUERY spq;
    spq.QueryType = PropertyStandardQuery;
    spq.PropertyId = StorageDeviceProperty;

    DWORD dwRet;
    HANDLE hdevice = reinterpret_cast<HANDLE>(_get_osfhandle(this->h));
    if (DeviceIoControl(hdevice, IOCTL_STORAGE_QUERY_PROPERTY, &spq, sizeof(spq), pDevDesc, pDevDesc->Size, &dwRet, nullptr) && pDevDesc->ProductIdOffset)
    {
        // We've read something, so clear existing values
        strMakeModel = strFirmwareRevision = strSerialNumber = "";

        if (pDevDesc->VendorIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->VendorIdOffset);
            strMakeModel = util::trim(s);
        }

        if (pDevDesc->ProductIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductIdOffset);
            strMakeModel += util::trim(s);
        }

        if (pDevDesc->ProductRevisionOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductRevisionOffset);
            strFirmwareRevision = util::trim(s);
        }

        if (pDevDesc->SerialNumberOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->SerialNumberOffset);
            strSerialNumber = util::trim(s);
        }

        return true;
    }
#endif // WIN32

#ifdef HAVE_LINUX_HDREG_H
    (void)path; // unused
    static struct hd_driveid hd;

    // ATA query
    if (!ioctl(h, HDIO_GET_IDENTITY, &hd))
    {
        std::string s = std::string(reinterpret_cast<const char*>(hd.model), 40);
        strMakeModel = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.serial_no), 20);
        strSerialNumber = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.fw_rev), 8);
        strFirmwareRevision = util::trim(s);

        return true;
    }
#endif // HDIO_GET_IDENTITY

#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    // SCSI query
    {
        uint8_t buf[96];

        static const uint8_t cmdInquiry[] = {
            INQUIRY, 0, 0, 0, sizeof(buf), 0
        };
        static const uint8_t cmdSerial[] = {
            INQUIRY, 0x01, 0x80, 0, sizeof(buf), 0
        };

        // Read the device details
        if (ScsiCmd(h, cmdInquiry, sizeof(cmdInquiry), buf, sizeof(buf), true) == 0)
        {
            /*
                        // Vendor identification (8-15)
                        std::string s = std::string(reinterpret_cast<char*>(buf+8), 8);
                        strMakeModel = util::trim(s);
            */
            // Product identification (16-31)
            auto s = std::string(reinterpret_cast<char*>(buf + 16), 16);
            strMakeModel = util::trim(s);

            // Product revision level (32-35)
            s = std::string(reinterpret_cast<char*>(buf + 32), 4);
            strFirmwareRevision = util::trim(s);

            // Read the device serial number
            if (ScsiCmd(h, cmdSerial, sizeof(cmdSerial), buf, sizeof(buf), true) == 0)
            {
                if (buf[1] == 0x80) // Page 80h = Unit serial number
                {
                    s = std::string(reinterpret_cast<char*>(buf + 4), buf[3]);
                    strSerialNumber = util::trim(s);
                }
            }

            return true;
        }
    }
#endif

#if defined(HAVE_DISKARBITRATION_DISKARBITRATION_H)
    DASessionRef session = DASessionCreate(kCFAllocatorDefault);
    DADiskRef disk = DADiskCreateFromBSDName(kCFAllocatorDefault, session, path.c_str());
    if (disk)
    {
        CFDictionaryRef diskInfo = DADiskCopyDescription(disk);
        if (diskInfo)
        {
            // Clear existing values
            strMakeModel = strFirmwareRevision = strSerialNumber = "";

            auto strVendor = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceVendorKey));
            auto strModel = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceModelKey));
            auto strRevision = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceRevisionKey));

            if (strVendor)
            {
                std::string s = CFStringGetCStringPtr(strVendor, 0);
                strMakeModel = util::trim(s);
            }

            if (strModel)
            {
                std::string s = CFStringGetCStringPtr(strModel, 0);
                strMakeModel += util::trim(s);
            }

            if (strRevision)
            {
                std::string s = CFStringGetCStringPtr(strRevision, 0);
                strFirmwareRevision = util::trim(s);
            }

            CFRelease(diskInfo);
        }

        CFRelease(disk);
        CFRelease(session);
    }
#endif // HAVE_DISKARBITRATION_DISKARBITRATION_H

    return false;
}